

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightweightsemaphore.h
# Opt level: O3

__pid_t __thiscall duckdb_moodycamel::details::Semaphore::wait(Semaphore *this,void *__stat_loc)

{
  uint uVar1;
  int *piVar2;
  
  do {
    uVar1 = sem_wait((sem_t *)this);
    piVar2 = (int *)(ulong)uVar1;
    if (uVar1 != 0xffffffff) break;
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  return (__pid_t)CONCAT71((int7)((ulong)piVar2 >> 8),uVar1 == 0);
}

Assistant:

bool wait()
	{
		// http://stackoverflow.com/questions/2013181/gdb-causes-sem-wait-to-fail-with-eintr-error
		int rc;
		do {
			rc = sem_wait(&m_sema);
		} while (rc == -1 && errno == EINTR);
		return rc == 0;
	}